

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FiniteStateMachine.hpp
# Opt level: O0

void __thiscall
peach::fsm::Node::addTransition<peach::transition::SingleCharTransition,char&>
          (Node *this,shared_ptr<peach::fsm::Node> *nextNode,char *args)

{
  unique_ptr<peach::transition::SingleCharTransition,_std::default_delete<peach::transition::SingleCharTransition>_>
  local_28;
  __single_object newTransition;
  char *args_local;
  shared_ptr<peach::fsm::Node> *nextNode_local;
  Node *this_local;
  
  newTransition._M_t.
  super___uniq_ptr_impl<peach::transition::SingleCharTransition,_std::default_delete<peach::transition::SingleCharTransition>_>
  ._M_t.
  super__Tuple_impl<0UL,_peach::transition::SingleCharTransition_*,_std::default_delete<peach::transition::SingleCharTransition>_>
  .super__Head_base<0UL,_peach::transition::SingleCharTransition_*,_false>._M_head_impl =
       (__uniq_ptr_data<peach::transition::SingleCharTransition,_std::default_delete<peach::transition::SingleCharTransition>,_true,_true>
        )(__uniq_ptr_data<peach::transition::SingleCharTransition,_std::default_delete<peach::transition::SingleCharTransition>,_true,_true>
          )args;
  std::make_unique<peach::transition::SingleCharTransition,char&>((char *)&local_28);
  std::
  vector<std::pair<std::unique_ptr<peach::transition::CharTransition,std::default_delete<peach::transition::CharTransition>>,std::shared_ptr<peach::fsm::Node>>,std::allocator<std::pair<std::unique_ptr<peach::transition::CharTransition,std::default_delete<peach::transition::CharTransition>>,std::shared_ptr<peach::fsm::Node>>>>
  ::
  emplace_back<std::unique_ptr<peach::transition::SingleCharTransition,std::default_delete<peach::transition::SingleCharTransition>>,std::shared_ptr<peach::fsm::Node>>
            ((vector<std::pair<std::unique_ptr<peach::transition::CharTransition,std::default_delete<peach::transition::CharTransition>>,std::shared_ptr<peach::fsm::Node>>,std::allocator<std::pair<std::unique_ptr<peach::transition::CharTransition,std::default_delete<peach::transition::CharTransition>>,std::shared_ptr<peach::fsm::Node>>>>
              *)this,&local_28,nextNode);
  std::
  unique_ptr<peach::transition::SingleCharTransition,_std::default_delete<peach::transition::SingleCharTransition>_>
  ::~unique_ptr(&local_28);
  return;
}

Assistant:

void addTransition(std::shared_ptr<Node> nextNode, TransitionArgs &&... args)
    {
        auto newTransition = std::make_unique<Transition>(std::forward<TransitionArgs>(args)...);
        transitions_.emplace_back(std::move(newTransition), std::move(nextNode));
    }